

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____24::test()::EntityDestroyedEventReceiver::
receive(entityx::EntityDestroyedEvent_const__
          (EntityDestroyedEventReceiver *this,EntityDestroyedEvent *event)

{
  value_type *in_RDI;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> *unaff_retaddr;
  
  Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

void receive(const EntityDestroyedEvent &event) {
      destroyed.push_back(event.entity);
    }